

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_source_free(ScpServer *s)

{
  ScpServerVtable *ptr;
  int iVar1;
  ScpSourceStackEntry *node;
  ScpSource *scp;
  ScpServer *s_local;
  
  scp_reply_cleanup((ScpReplyReceiver *)(s + -0x10));
  while (0 < *(int *)&s[-0x13].vt) {
    iVar1 = *(int *)&s[-0x13].vt + -1;
    *(int *)&s[-0x13].vt = iVar1;
    strbuf_free((strbuf *)s[(long)iVar1 + -0x16].vt);
  }
  while (s[-0x18].vt != (ScpServerVtable *)0x0) {
    ptr = s[-0x18].vt;
    s[-0x18].vt = (ScpServerVtable *)ptr->free;
    safefree(ptr);
  }
  delete_callbacks_for_context(s + -0x1b);
  safefree(s + -0x1b);
  return;
}

Assistant:

static void scp_source_free(ScpServer *s)
{
    ScpSource *scp = container_of(s, ScpSource, scpserver);
    scp_reply_cleanup(&scp->reply);
    while (scp->n_pending_commands > 0)
        strbuf_free(scp->pending_commands[--scp->n_pending_commands]);
    while (scp->head) {
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;
        sfree(node);
    }

    delete_callbacks_for_context(scp);

    sfree(scp);
}